

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O3

int KINSetNoResMon(void *kinmem,int noResMon)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINSetNoResMon","kinsol_mem = NULL illegal.");
  }
  else {
    *(int *)((long)kinmem + 100) = noResMon;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINSetNoResMon(void *kinmem, booleantype noResMon)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetNoResMon", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;
  kin_mem->kin_noResMon = noResMon;

  return(KIN_SUCCESS);
}